

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

int __thiscall Epanet::Project::writeReport(Project *this)

{
  pointer pcVar1;
  FileError *this_00;
  string local_58;
  undefined1 local_38 [8];
  ReportWriter reportWriter;
  
  if (this->outputFileOpened != false) {
    ReportWriter::ReportWriter((ReportWriter *)local_38,&this->rptFile,&this->network);
    pcVar1 = (this->inpFileName)._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + (this->inpFileName)._M_string_length);
    ReportWriter::writeReport((ReportWriter *)local_38,&local_58,&this->outputFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    ReportWriter::~ReportWriter((ReportWriter *)local_38);
    return 0;
  }
  this_00 = (FileError *)__cxa_allocate_exception(0x30);
  FileError::FileError(this_00,9);
  __cxa_throw(this_00,&FileError::typeinfo,ENerror::~ENerror);
}

Assistant:

int Project::writeReport()
    {
        try
        {
            if ( !outputFileOpened )
            {
                throw FileError(FileError::NO_RESULTS_SAVED_TO_REPORT);
            }
            ReportWriter reportWriter(rptFile, &network);
            reportWriter.writeReport(inpFileName, &outputFile);
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }